

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O0

bool __thiscall wmj::fileWatcher::fileWatcher::watchOnce(fileWatcher *this)

{
  long lVar1;
  inotify_event *__buf;
  ssize_t sVar2;
  inotify_event *event;
  char *c;
  uint mask;
  ssize_t readnum;
  char *a;
  fileWatcher *this_local;
  
  lVar1 = std::__cxx11::string::size();
  __buf = (inotify_event *)operator_new__((lVar1 + 0x11) * 10);
  sVar2 = read(this->inotify_fd,__buf,100);
  if (0 < sVar2) {
    c._4_4_ = 0;
    for (event = __buf; event < (inotify_event *)((long)&__buf->wd + sVar2);
        event = (inotify_event *)((long)&event[1].wd + (ulong)event->len)) {
      if (event->wd == this->wd) {
        c._4_4_ = event->mask | c._4_4_;
      }
    }
    if (((c._4_4_ & 0x8000) == 0) && ((c._4_4_ & 8) != 0)) {
      if (__buf != (inotify_event *)0x0) {
        operator_delete__(__buf);
      }
      return true;
    }
    if (((c._4_4_ & 0x400) != 0) || ((c._4_4_ & 0x800) != 0)) {
      stopWatch(this);
      startWatch(this);
      if (__buf != (inotify_event *)0x0) {
        operator_delete__(__buf);
      }
      return true;
    }
    if ((c._4_4_ & 4) != 0) {
      stopWatch(this);
      startWatch(this);
      if (__buf != (inotify_event *)0x0) {
        operator_delete__(__buf);
      }
      return false;
    }
  }
  if (__buf != (inotify_event *)0x0) {
    operator_delete__(__buf);
  }
  return false;
}

Assistant:

bool fileWatcher::watchOnce() {
    char *a = new char[(10 * (sizeof(struct inotify_event) + file_name.size() + 1))];
    auto readnum = read(inotify_fd, a, 100);
    if(readnum > 0) {
        unsigned int mask  = 0;
        for(auto c = a; c < a + readnum;) {
            auto event = (struct inotify_event *) c;
            if(event->wd == this->wd) {
                mask |= event->mask;
            }
            c += sizeof(struct inotify_event) + event->len;
        }
        if((mask & IN_IGNORED) == 0 &&
                (mask & IN_CLOSE_WRITE)) {
            // 在文件被写入关闭或者文件被覆盖的时候说明文件被修改
            delete[] a;
            return true;
        } else if(mask & IN_DELETE_SELF  || mask & IN_MOVE_SELF) {
            // 如果你使用mv命令覆盖文件，文件
            // 只是发生了一次没有读入的写,此
            // 时只会触发此处
            stopWatch();
            startWatch();
            delete[] a;
            return true;
        } else if(mask & IN_ATTRIB) {
            // 一些编辑器(比如vim)使用文件覆盖的方法
            // 写入文件，此时需要重新启动一次读
            stopWatch();
            startWatch();
            delete[] a;
            return false;
        }

    }
    delete[] a;
    return false;
}